

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Generators::GeneratorUntypedBase::countedNext(GeneratorUntypedBase *this)

{
  uint uVar1;
  bool ret;
  GeneratorUntypedBase *this_local;
  
  uVar1 = (**this->_vptr_GeneratorUntypedBase)();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::clear();
    this->m_currentElementIndex = this->m_currentElementIndex + 1;
  }
  return (bool)((byte)uVar1 & 1);
}

Assistant:

bool GeneratorUntypedBase::countedNext() {
            auto ret = next();
            if ( ret ) {
                m_stringReprCache.clear();
                ++m_currentElementIndex;
            }
            return ret;
        }